

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Text.cpp
# Opt level: O1

void anon_unknown.dwarf_5393be::addGlyphQuad
               (VertexArray *vertices,Vector2f position,Color *color,Glyph *glyph,float italicShear)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined1 in_register_00001244 [12];
  float fVar6;
  Vector2f local_d0;
  float local_c8;
  float local_c4;
  Vector2f local_c0;
  float local_b8;
  float fStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  Vertex local_9c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  float local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_38;
  uint uStack_34;
  uint uStack_30;
  uint uStack_2c;
  
  fStack_84 = position.y;
  fVar6 = (glyph->bounds).left;
  fVar1 = (glyph->bounds).top;
  local_c4 = fVar1 + -1.0;
  local_88 = fVar1 + (glyph->bounds).height + 1.0;
  local_c8 = fVar6 + -1.0 + position.x;
  uStack_64 = in_register_00001244._0_4_ ^ 0x80000000;
  uStack_60 = in_register_00001244._4_4_ ^ 0x80000000;
  uStack_5c = in_register_00001244._8_4_ ^ 0x80000000;
  local_68 = -italicShear * local_c4;
  local_c0.x = local_68 + local_c8;
  fVar6 = fVar6 + (glyph->bounds).width + 1.0 + position.x;
  local_c4 = local_c4 + fStack_84;
  uVar2 = (glyph->textureRect).left;
  uVar4 = (glyph->textureRect).top;
  local_78 = (float)(int)uVar2 + -1.0;
  fStack_74 = (float)(int)uVar4 + -1.0;
  uStack_70 = 0;
  uStack_6c = 0;
  local_d0.y = fStack_74;
  local_d0.x = local_78;
  local_68 = local_68 + fVar6;
  local_38 = -italicShear * local_88;
  local_c8 = local_c8 + local_38;
  local_88 = fStack_84 + local_88;
  local_38 = local_38 + fVar6;
  uVar3 = (glyph->textureRect).width;
  uVar5 = (glyph->textureRect).height;
  local_b8 = (float)(int)(uVar3 + uVar2) + 1.0;
  fStack_b4 = (float)(int)(uVar5 + uVar4) + 1.0;
  uStack_b0 = 0;
  uStack_ac = 0;
  local_c0.y = local_c4;
  fStack_80 = fStack_84;
  fStack_7c = fStack_84;
  local_58 = fStack_74;
  fStack_54 = fStack_74;
  fStack_50 = fStack_74;
  fStack_4c = fStack_74;
  uStack_34 = uStack_64;
  uStack_30 = uStack_60;
  uStack_2c = uStack_5c;
  sf::Vertex::Vertex(&local_9c,&local_c0,color,&local_d0);
  sf::VertexArray::append(vertices,&local_9c);
  local_c0.x = local_68;
  local_c0.y = local_c4;
  local_d0.y = local_58;
  local_d0.x = local_b8;
  sf::Vertex::Vertex(&local_9c,&local_c0,color,&local_d0);
  sf::VertexArray::append(vertices,&local_9c);
  local_c0.x = local_c8;
  local_c0.y = local_88;
  local_48 = fStack_b4;
  fStack_44 = fStack_b4;
  fStack_40 = fStack_b4;
  fStack_3c = fStack_b4;
  local_d0.y = fStack_b4;
  local_d0.x = local_78;
  sf::Vertex::Vertex(&local_9c,&local_c0,color,&local_d0);
  sf::VertexArray::append(vertices,&local_9c);
  local_c0.x = local_c8;
  local_c0.y = local_88;
  local_d0.y = local_48;
  local_d0.x = local_78;
  sf::Vertex::Vertex(&local_9c,&local_c0,color,&local_d0);
  sf::VertexArray::append(vertices,&local_9c);
  local_c0.x = local_68;
  local_c0.y = local_c4;
  local_d0.y = local_58;
  local_d0.x = local_b8;
  sf::Vertex::Vertex(&local_9c,&local_c0,color,&local_d0);
  sf::VertexArray::append(vertices,&local_9c);
  local_c0.x = local_38;
  local_c0.y = local_88;
  local_d0.y = fStack_b4;
  local_d0.x = local_b8;
  sf::Vertex::Vertex(&local_9c,&local_c0,color,&local_d0);
  sf::VertexArray::append(vertices,&local_9c);
  return;
}

Assistant:

void addGlyphQuad(sf::VertexArray& vertices, sf::Vector2f position, const sf::Color& color, const sf::Glyph& glyph, float italicShear)
    {
        float padding = 1.0;

        float left   = glyph.bounds.left - padding;
        float top    = glyph.bounds.top - padding;
        float right  = glyph.bounds.left + glyph.bounds.width + padding;
        float bottom = glyph.bounds.top  + glyph.bounds.height + padding;

        float u1 = static_cast<float>(glyph.textureRect.left) - padding;
        float v1 = static_cast<float>(glyph.textureRect.top) - padding;
        float u2 = static_cast<float>(glyph.textureRect.left + glyph.textureRect.width) + padding;
        float v2 = static_cast<float>(glyph.textureRect.top  + glyph.textureRect.height) + padding;

        vertices.append(sf::Vertex(sf::Vector2f(position.x + left  - italicShear * top   , position.y + top),    color, sf::Vector2f(u1, v1)));
        vertices.append(sf::Vertex(sf::Vector2f(position.x + right - italicShear * top   , position.y + top),    color, sf::Vector2f(u2, v1)));
        vertices.append(sf::Vertex(sf::Vector2f(position.x + left  - italicShear * bottom, position.y + bottom), color, sf::Vector2f(u1, v2)));
        vertices.append(sf::Vertex(sf::Vector2f(position.x + left  - italicShear * bottom, position.y + bottom), color, sf::Vector2f(u1, v2)));
        vertices.append(sf::Vertex(sf::Vector2f(position.x + right - italicShear * top   , position.y + top),    color, sf::Vector2f(u2, v1)));
        vertices.append(sf::Vertex(sf::Vector2f(position.x + right - italicShear * bottom, position.y + bottom), color, sf::Vector2f(u2, v2)));
    }